

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsInteractionTestUtil.hpp
# Opt level: O0

void __thiscall deqp::gls::InteractionTestUtil::StencilState::StencilState(StencilState *this)

{
  StencilState *this_local;
  
  this->function = 0;
  this->reference = 0;
  this->compareMask = 0;
  this->stencilFailOp = 0;
  this->depthFailOp = 0;
  this->depthPassOp = 0;
  this->writeMask = 0;
  return;
}

Assistant:

StencilState (void)
		: function		(0)
		, reference		(0)
		, compareMask	(0)
		, stencilFailOp	(0)
		, depthFailOp	(0)
		, depthPassOp	(0)
		, writeMask		(0)
	{
	}